

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                    (string *str,uint8_t *target)

{
  uint uVar1;
  uint32_t value;
  ulong uVar2;
  LogMessage *other;
  uint8_t *puVar3;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  uint8_t *local_18;
  uint8_t *target_local;
  string *str_local;
  
  local_18 = target;
  target_local = (uint8_t *)str;
  uVar2 = std::__cxx11::string::size();
  uVar1 = std::numeric_limits<unsigned_int>::max();
  local_51 = 0;
  if (uVar1 < uVar2) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x3b5);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,
                       "CHECK failed: (str.size()) <= (std::numeric_limits<uint32_t>::max()): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  value = std::__cxx11::string::size();
  local_18 = WriteVarint32ToArray(value,local_18);
  puVar3 = WriteStringToArray((string *)target_local,local_18);
  return puVar3;
}

Assistant:

uint8_t* CodedOutputStream::WriteStringWithSizeToArray(const std::string& str,
                                                     uint8_t* target) {
  GOOGLE_DCHECK_LE(str.size(), std::numeric_limits<uint32_t>::max());
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}